

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoa.hpp
# Opt level: O3

double __thiscall ear::hoa::norm_N3D(hoa *this,int n,int abs_m)

{
  uint uVar1;
  lanczos17m64 *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar2;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble in_ST1;
  double dVar4;
  double dVar5;
  detail local_6a;
  undefined1 local_69;
  longdouble local_68;
  double local_58;
  double local_50;
  ulong local_48;
  double local_40;
  double local_38;
  ulong local_30;
  longdouble local_24;
  
  iVar2 = (int)this;
  uVar1 = iVar2 - n;
  if (uVar1 < 0xab) {
    dVar4 = (double)*(longdouble *)(&DAT_001b9ba0 + (ulong)uVar1 * 0x10);
    local_40 = dVar4;
  }
  else {
    local_30 = (ulong)(uVar1 + 1);
    boost::math::detail::
    gamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
              ((longdouble *)&local_69,&local_6a,(longdouble)local_30,
               (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                *)CONCAT44(in_register_00000014,abs_m),in_RCX);
    abs_m = extraout_EDX;
    in_register_00000014 = extraout_var;
    lVar3 = in_ST0;
    if ((longdouble)1.79769313486232e+308 < ABS(in_ST0)) {
      local_68 = in_ST0;
      boost::math::policies::detail::raise_error<std::overflow_error,double>
                ("boost::math::tgamma<%1%>(%1%)","numeric overflow");
      abs_m = extraout_EDX_00;
      in_register_00000014 = extraout_var_00;
      lVar3 = local_68;
    }
    in_ST0 = in_ST1;
    dVar4 = (double)lVar3;
    local_38 = dVar4;
    if (dVar4 <= 1.79769313486232e+308) {
      dVar4 = floor(dVar4 + 0.5);
      abs_m = extraout_EDX_01;
      in_register_00000014 = extraout_var_01;
    }
  }
  uVar1 = n + iVar2;
  if (uVar1 < 0xab) {
    dVar5 = (double)*(longdouble *)(&DAT_001b9ba0 + (ulong)uVar1 * 0x10);
    local_58 = dVar5;
  }
  else {
    local_68 = (longdouble)CONCAT28(local_68._8_2_,dVar4);
    local_48 = (ulong)(uVar1 + 1);
    boost::math::detail::
    gamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
              ((longdouble *)&local_69,&local_6a,(longdouble)local_48,
               (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                *)CONCAT44(in_register_00000014,abs_m),in_RCX);
    if ((longdouble)1.79769313486232e+308 < ABS(in_ST0)) {
      local_24 = in_ST0;
      boost::math::policies::detail::raise_error<std::overflow_error,double>
                ("boost::math::tgamma<%1%>(%1%)","numeric overflow");
      in_ST0 = local_24;
    }
    dVar5 = (double)in_ST0;
    local_50 = dVar5;
    if (dVar5 <= 1.79769313486232e+308) {
      dVar5 = floor(dVar5 + 0.5);
    }
    dVar4 = local_68._0_8_;
  }
  dVar5 = (((double)iVar2 + (double)iVar2 + 1.0) * dVar4) / dVar5;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  return dVar5;
}

Assistant:

inline double norm_N3D(int n, int abs_m) {
      return std::sqrt((2.0 * n + 1.0) *
                       boost::math::factorial<double>(n - abs_m) /
                       boost::math::factorial<double>(n + abs_m));
    }